

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
 __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::
iterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::Literal*>
          (SubstitutionTree<Indexing::LiteralClause> *this,Literal *query,bool retrieveSubstitutions
          ,bool reversed)

{
  byte bVar1;
  bool bVar2;
  byte in_CL;
  byte bVar3;
  SubstitutionTree<Indexing::LiteralClause> *in_RDX;
  Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_RSI;
  SubstitutionTree<Indexing::LiteralClause> *in_RDI;
  byte in_R8B;
  Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  Literal *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  
  bVar3 = in_CL & 1;
  bVar1 = in_R8B & 1;
  bVar2 = isEmpty(in_RDI);
  if (bVar2) {
    Lib::
    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
    ::getEmpty();
  }
  else {
    Lib::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
    ::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>*,Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*,Kernel::Literal*,bool,bool>
              (in_RSI,in_RDX,(Node *)CONCAT17(bVar3,CONCAT16(bVar1,in_stack_ffffffffffffffe0)),
               in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7,
               (bool)in_stack_ffffffffffffffd6);
    Lib::
    iterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
              (in_stack_ffffffffffffffc8);
    Lib::
    pvi<Lib::IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>>>
              ((IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
                *)in_stack_ffffffffffffffd8);
    Lib::
    IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
    ::~IterTraits((IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
                   *)0x320a2b);
    Lib::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)CONCAT17(in_stack_ffffffffffffffd7,
                            CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)));
  }
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
            *)in_RDI;
}

Assistant:

auto iterator(TermOrLit query, bool retrieveSubstitutions, bool reversed, Args... args)
  { return isEmpty() ? VirtualIterator<ELEMENT_TYPE(I)>::getEmpty()
                     : pvi(iterPointer(Recycled<I>(this, _root, query, retrieveSubstitutions, reversed, std::move(args)...)));
  }